

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_IF(Context *ctx)

{
  char local_98 [8];
  char src0 [64];
  char buf [64];
  Context *ctx_local;
  
  if (ctx->profile_supports_nv2 == 0) {
    failf(ctx,"branching unsupported in %s profile",ctx->profile->name);
  }
  else {
    allocate_ARB1_scratch_reg_name(ctx,src0 + 0x38,0x40);
    get_ARB1_srcarg_varname(ctx,0,local_98,0x40);
    output_line(ctx,"MOVC %s.x, %s;",src0 + 0x38,local_98);
    nv2_if(ctx);
  }
  return;
}

Assistant:

static void emit_ARB1_IF(Context *ctx)
{
    if (support_nv2(ctx))
    {
        char buf[64]; allocate_ARB1_scratch_reg_name(ctx, buf, sizeof (buf));
        char src0[64]; get_ARB1_srcarg_varname(ctx, 0, src0, sizeof (src0));
        output_line(ctx, "MOVC %s.x, %s;", buf, src0);
        nv2_if(ctx);
    } // if

    else  // stock ARB1 has no branching.
    {
        failf(ctx, "branching unsupported in %s profile", ctx->profile->name);
    } // else
}